

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloca.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::alloca_destructor<char>::~alloca_destructor(alloca_destructor<char> *this)

{
  index_type iVar1;
  char *pcVar2;
  char *o;
  char *__end0;
  char *__begin0;
  span<char> *__range4;
  alloca_destructor<char> *this_local;
  
  iVar1 = span<char>::size(&this->objects);
  if (iVar1 < 0x1001) {
    __end0 = span<char>::begin(&this->objects);
    pcVar2 = span<char>::end(&this->objects);
    for (; __end0 != pcVar2; __end0 = __end0 + 1) {
    }
  }
  else {
    pcVar2 = span<char>::data(&this->objects);
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
  }
  return;
}

Assistant:

~alloca_destructor()
	{
		if (objects.size() > cutoff)
		{
			delete [] objects.data();
		}
		else
		{
			for (auto& o : objects)
			{
				TORRENT_UNUSED(o);
				o.~T();
			}
		}
	}